

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtIsConst0(word *pIn1,int nWords)

{
  int local_20;
  int w;
  int nWords_local;
  word *pIn1_local;
  
  local_20 = 0;
  while( true ) {
    if (nWords <= local_20) {
      return 1;
    }
    if (pIn1[local_20] != 0) break;
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

static inline int Abc_TtIsConst0( word * pIn1, int nWords )
{
    int w;
    for ( w = 0; w < nWords; w++ )
        if ( pIn1[w] )
            return 0;
    return 1;
}